

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O0

double __thiscall
Kriging::_logMargPost
          (Kriging *this,vec *_theta,vec *grad_out,KModel *model,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *bench)

{
  uword uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uword uVar6;
  uword uVar7;
  double *pdVar8;
  uint *puVar9;
  double dVar10;
  vec *in_RCX;
  vec *in_RDX;
  Kriging *in_RSI;
  long in_RDI;
  KModel *in_R8;
  result rVar11;
  result rVar12;
  double dVar13;
  KModel *this_00;
  double dVar14;
  vec theta_eps;
  uword k_1;
  double _eps;
  mat gradR_k;
  uword k;
  mat Wb_k;
  uword j;
  uword i;
  cube gradR;
  mat Q_output;
  vec ans;
  double log_approx_ref_prior;
  double t;
  vec CL;
  double b;
  double a;
  double log_marginal_lik;
  double log_S_2;
  double sigma2;
  mat S_2;
  mat yt_Rinv;
  mat Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
  mat LX;
  mat Xt_Rinv_X;
  mat Rinv_X;
  time_point t0;
  uword p;
  uword d;
  uword n;
  KModel m;
  uword len_2;
  uword col_offset_2;
  uword row_offset_2;
  uword len_1;
  uword col_offset_1;
  uword row_offset_1;
  uword len;
  uword col_offset;
  uword row_offset;
  undefined4 in_stack_ffffffffffffc4b8;
  uword in_stack_ffffffffffffc4bc;
  KModel *in_stack_ffffffffffffc4c0;
  Mat<double> *in_stack_ffffffffffffc4c8;
  Cube<double> *in_stack_ffffffffffffc4d0;
  Mat<double> *in_stack_ffffffffffffc4d8;
  subview_col<double> *in_stack_ffffffffffffc4e0;
  Col<double> *in_stack_ffffffffffffc4e8;
  mat *in_stack_ffffffffffffc4f0;
  undefined4 in_stack_ffffffffffffc4f8;
  undefined4 in_stack_ffffffffffffc4fc;
  uword uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc500;
  Proxy<arma::Col<double>_> *this_01;
  string *in_stack_ffffffffffffc578;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_ffffffffffffc580;
  time_point in_stack_ffffffffffffc588;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::eglue_minus>
  *in_stack_ffffffffffffc590;
  undefined6 in_stack_ffffffffffffc598;
  undefined1 in_stack_ffffffffffffc59e;
  undefined1 in_stack_ffffffffffffc59f;
  subview_cube<double> *in_stack_ffffffffffffc678;
  Cube<double> *in_stack_ffffffffffffc680;
  Cube<double> *in_stack_ffffffffffffc698;
  uword in_stack_ffffffffffffc6a0;
  undefined3 uVar16;
  uword in_stack_ffffffffffffc6a4;
  double in_stack_ffffffffffffc6a8;
  undefined1 local_3728 [32];
  long local_3708;
  uint local_3674;
  double local_3670;
  eOp<arma::Col<double>,_arma::eop_square> local_35b8;
  eOp<arma::Col<double>,_arma::eop_scalar_times> local_3578;
  eOp<arma::Col<double>,_arma::eop_scalar_times> local_3538;
  eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> local_34f8;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  local_34b8;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  local_3498;
  Proxy<arma::Col<double>_> local_3478 [2];
  rep local_3450;
  allocator<char> local_3441;
  string local_3440 [32];
  duration local_3420;
  Op<arma::Mat<double>,_arma::op_htrans> local_3418;
  Op<arma::Col<double>,_arma::op_htrans> local_33d8;
  Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>
  local_3398;
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  local_3380;
  diagview<double> local_3368;
  rep local_3348;
  allocator<char> local_3339;
  string local_3338 [32];
  duration local_3318;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_3310 [8];
  Op<arma::Mat<double>,_arma::op_htrans> local_3248 [3];
  Mat<double> local_3158;
  Op<arma::Mat<double>,_arma::op_htrans> local_30a8;
  undefined1 local_3068 [208];
  int local_2f98;
  int local_2f88;
  int local_2f68;
  int local_2f64;
  rep local_2eb0;
  allocator<char> local_2ea1;
  string local_2ea0 [32];
  duration local_2e80;
  Mat<double> local_2e78;
  duration local_2dc8;
  uint local_2dbc;
  Mat<double> local_2db8;
  rep local_2d00;
  allocator<char> local_2cf1;
  string local_2cf0 [32];
  duration local_2cd0;
  subview_cube<double> local_2cc8;
  subview_cube<double> local_2c98;
  subview_cube<double> local_2c68;
  undefined1 local_2c38 [224];
  undefined1 local_2b58 [176];
  eOp<arma::Col<double>,_arma::eop_scalar_times> local_2aa8;
  uint local_2a60;
  uint local_2a5c;
  uint local_2a58;
  uint local_2a54;
  uword local_2a4c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_ffffffffffffd820;
  vec *in_stack_ffffffffffffd828;
  Kriging *in_stack_ffffffffffffd830;
  string local_27c8 [32];
  duration local_27a8;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> local_27a0;
  Op<arma::Mat<double>,_arma::op_htrans> local_2788;
  undefined1 local_2748 [208];
  int local_2678;
  int local_2668;
  int local_2648 [44];
  Mat<double> local_2598;
  Col<double> local_24e8;
  duration local_2438;
  double local_2430;
  Proxy<arma::Col<double>_> local_2428;
  Proxy<arma::Col<double>_> local_2418;
  result local_2408;
  rep local_2400;
  allocator<char> local_23f1;
  string local_23f0 [32];
  duration local_23d0;
  Op<arma::Mat<double>,_arma::op_min> local_23c8;
  Op<arma::Mat<double>,_arma::op_max> local_2388;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  local_2348;
  Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
  local_21e8;
  undefined1 local_21a8 [464];
  Col<double> local_1fd8;
  double local_1f20;
  double local_1f18;
  rep local_1f10;
  allocator<char> local_1f01;
  string local_1f00 [32];
  duration local_1ee0;
  diagview<double> local_1ed8;
  eOp<arma::diagview<double>,_arma::eop_log> local_1eb8;
  diagview<double> local_1e78;
  eOp<arma::diagview<double>,_arma::eop_log> local_1e58;
  double local_1e18;
  double local_1e10;
  double local_1e08;
  rep local_1e00;
  allocator<char> local_1df1;
  string local_1df0 [32];
  duration local_1dd0;
  Op<arma::Col<double>,_arma::op_htrans> local_1dc8;
  Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> local_1d80
  ;
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
  local_1d68;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> local_1d50;
  int local_1d38 [44];
  undefined1 auStack_1c88 [176];
  int local_1bd8 [8];
  long local_1bb8;
  rep local_1b20;
  allocator<char> local_1b11;
  string local_1b10 [32];
  duration local_1af0;
  Op<arma::Mat<double>,_arma::op_htrans> local_1ae8;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>
  local_1aa0;
  Op<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>,_arma::op_htrans>
  local_1a88;
  Mat<double> local_1a48;
  Op<arma::Mat<double>,_arma::op_htrans> local_1998 [6];
  Op<arma::Mat<double>,_arma::op_htrans> local_17f8 [3];
  Mat<double> local_1708;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_1650;
  Mat<double> local_1638 [2];
  Mat<double> local_14d8;
  Op<arma::Mat<double>,_arma::op_htrans> local_1428;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>
  local_13e0 [8];
  Op<arma::Mat<double>,_arma::op_htrans> local_1318 [3];
  Mat<double> local_1228;
  duration local_1178;
  int local_1170;
  uint local_116c;
  uint local_1168;
  int local_1158;
  long local_1138;
  Mat<double> local_10a8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_fffffffffffff4e0;
  uint local_ac0;
  uint local_abc;
  uint local_ab8;
  uword local_ab4;
  uword local_ab0;
  undefined4 local_aac;
  Mat<double> *local_aa8;
  diagview<double> *local_aa0;
  uint local_a98;
  uint local_a94;
  uint local_a90;
  uword local_a8c;
  uword local_a88;
  undefined4 local_a84;
  Mat<double> *local_a80;
  diagview<double> *local_a78;
  uint local_a70;
  uint local_a6c;
  uint local_a68;
  uword local_a64;
  uword local_a60;
  undefined4 local_a5c;
  Mat<double> *local_a58;
  diagview<double> *local_a50;
  Mat<double> *local_a48;
  Op<arma::Mat<double>,_arma::op_htrans> *local_a40;
  Mat<double> *local_a38;
  Op<arma::Mat<double>,_arma::op_htrans> *local_a30;
  uint local_a28;
  uint local_a24;
  Cube<double> *local_a20;
  subview_cube<double> *local_a18;
  uint local_a10;
  uint local_a0c;
  Cube<double> *local_a08;
  subview_cube<double> *local_a00;
  uint local_9f8;
  uint local_9f4;
  Cube<double> *local_9f0;
  subview_cube<double> *local_9e8;
  Col<double> *local_9e0;
  double local_9d8;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_9d0;
  Col<double> *local_9c8;
  double local_9c0;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_9b8;
  undefined1 *local_9b0;
  double local_9a8;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_9a0;
  int local_994;
  long local_990;
  undefined1 *local_988;
  Mat<double> *local_980;
  Op<arma::Mat<double>,_arma::op_htrans> *local_978;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> *local_970
  ;
  Mat<double> *local_968;
  Mat<double> *local_960;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_958;
  Mat<double> *local_950;
  Mat<double> *local_948;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_940;
  undefined8 local_938;
  Mat<double> *local_930;
  Op<arma::Mat<double>,_arma::op_htrans> *local_928;
  undefined8 local_920;
  Mat<double> *local_918;
  Op<arma::Mat<double>,_arma::op_htrans> *local_910;
  undefined8 local_908;
  Mat<double> *local_900;
  Op<arma::Mat<double>,_arma::op_htrans> *local_8f8;
  undefined8 local_8f0;
  Mat<double> *local_8e8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_8e0;
  undefined8 local_8d8;
  Mat<double> *local_8d0;
  Op<arma::Mat<double>,_arma::op_htrans> *local_8c8;
  undefined8 local_8c0;
  Mat<double> *local_8b8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_8b0;
  undefined8 local_8a8;
  Mat<double> *local_8a0;
  Op<arma::Mat<double>,_arma::op_htrans> *local_898;
  undefined8 local_890;
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>
  *local_888;
  Op<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>,_arma::op_htrans>
  *local_880;
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
  *local_878;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *local_870;
  int *local_868;
  Col<double> *local_860;
  Mat<double> *local_858;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *local_850;
  Col<double> *local_848;
  Mat<double> *local_840;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *local_838;
  Col<double> *local_830;
  Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> *local_828
  ;
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
  *local_820;
  Mat<double> *local_818;
  Op<arma::Col<double>,_arma::op_htrans> *local_810;
  Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times> *local_808
  ;
  undefined8 local_800;
  Col<double> *local_7f8;
  Op<arma::Col<double>,_arma::op_htrans> *local_7f0;
  undefined8 local_7e8;
  Col<double> *local_7e0;
  Op<arma::Col<double>,_arma::op_htrans> *local_7d8;
  int *local_7d0;
  int local_7c0;
  int local_7bc;
  int *local_7b8;
  double local_7b0;
  Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
  *local_7a8;
  undefined1 *local_7a0;
  undefined8 local_798;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  *local_790;
  Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
  *local_788;
  Op<arma::Mat<double>,_arma::op_min> *local_780;
  Op<arma::Mat<double>,_arma::op_max> *local_778;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  *local_770;
  undefined4 local_764;
  Mat<double> *local_760;
  Op<arma::Mat<double>,_arma::op_max> *local_758;
  undefined4 local_74c;
  Mat<double> *local_748;
  Op<arma::Mat<double>,_arma::op_min> *local_740;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  *local_738;
  Col<double> *local_720;
  Proxy<arma::Col<double>_> *local_718;
  Proxy<arma::Col<double>_> *local_710;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *local_700;
  Op<arma::Mat<double>,_arma::op_htrans> *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_6d8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  Mat<double> *local_6b0;
  Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>
  *local_6a8;
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
  *local_6a0;
  Op<arma::Mat<double>,_arma::op_htrans> *local_698;
  Op<arma::Col<double>,_arma::op_htrans> *local_690;
  Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>
  *local_688;
  uint local_67c;
  uint local_66c;
  undefined1 *local_668;
  uint local_65c;
  Col<double> *local_658;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_650;
  Col<double> *local_648;
  Proxy<arma::Col<double>_> *local_640;
  eOp<arma::Col<double>,_arma::eop_square> *local_638;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_630;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_628;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_620;
  eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> *local_618;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_610;
  result local_608;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_600;
  eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> *local_5f8;
  eOp<arma::Col<double>,_arma::eop_square> *local_5e8;
  Proxy<arma::Col<double>_> *local_5e0;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_5d0;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_5c0;
  uint local_5ac;
  uword local_5a8;
  uword local_5a4;
  Mat<double> *local_5a0;
  diagview<double> *local_598;
  uint local_58c;
  uword local_588;
  uword local_584;
  Mat<double> *local_580;
  diagview<double> *local_578;
  uint local_56c;
  uword local_568;
  uword local_564;
  Mat<double> *local_560;
  diagview<double> *local_558;
  uword local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  uint local_540;
  uint local_53c;
  Cube<double> *local_538;
  subview_cube<double> *local_530;
  uword local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  uint local_518;
  uint local_514;
  Cube<double> *local_510;
  subview_cube<double> *local_508;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  uint local_4f0;
  uint local_4ec;
  Cube<double> *local_4e8;
  subview_cube<double> *local_4e0;
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
  *local_4c8;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *local_4c0;
  int *local_4b8;
  string local_4a0 [32];
  char *local_480;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  int *local_468;
  int *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  Op<arma::Mat<double>,_arma::op_min> *local_438;
  Op<arma::Mat<double>,_arma::op_max> *local_430;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  *local_428;
  string local_410 [32];
  char *local_3f0;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  *local_3d8;
  eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>
  *local_3d0;
  Proxy<arma::Op<arma::Mat<double>,_arma::op_min>_> *local_3c8;
  Proxy<arma::Op<arma::Mat<double>,_arma::op_min>_> *local_3c0;
  Kriging *local_3b8;
  Col<double> *local_3b0;
  Proxy<arma::Col<double>_> *local_3a8;
  Proxy<arma::Col<double>_> *local_3a0;
  Proxy<arma::Col<double>_> *local_398;
  string local_380 [32];
  char *local_360;
  uword local_354;
  uword local_350;
  uword local_34c;
  uword local_348;
  Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *local_338;
  Op<arma::Mat<double>,_arma::op_htrans> *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  string local_308 [32];
  char *local_2e8;
  undefined4 local_2e0;
  int *local_2d0;
  int *local_2c8;
  undefined1 *local_2c0;
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *local_2a8;
  Op<arma::Mat<double>,_arma::op_htrans> *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  string local_278 [32];
  char *local_258;
  undefined1 *local_240;
  int *local_238;
  int *local_230;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_228;
  eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> *local_220;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_218;
  string local_200 [32];
  char *local_1e0;
  undefined4 local_1d8;
  uword local_1d4;
  undefined4 local_1d0;
  uword local_1cc;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_1c8;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_1c0;
  Proxy<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_> *local_1b8;
  Proxy<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_> *local_1a0;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_188;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_180;
  eOp<arma::Col<double>,_arma::eop_square> *local_178;
  eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>
  *local_170;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_168;
  string local_150 [32];
  char *local_130;
  undefined4 local_128;
  uword local_124;
  undefined4 local_120;
  uword local_11c;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_118;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_110;
  Proxy<arma::eOp<arma::Col<double>,_arma::eop_square>_> *local_108;
  Proxy<arma::eOp<arma::Col<double>,_arma::eop_square>_> *local_100;
  eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> *local_e8;
  eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> *local_e0;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_d8;
  eOp<arma::Col<double>,_arma::eop_scalar_times> *local_d0;
  eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>
  *local_b8;
  Col<double> *local_b0;
  Proxy<arma::Col<double>_> *local_a8;
  Proxy<arma::Col<double>_> *local_a0;
  string local_88 [32];
  char *local_68;
  undefined4 local_60;
  uword local_5c;
  uword local_58;
  uword local_54;
  Proxy<arma::Col<double>_> *local_50;
  Proxy<arma::Col<double>_> *local_48;
  Col<double> *local_40;
  Col<double> *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  make_Model(in_stack_ffffffffffffd830,in_stack_ffffffffffffd828,in_stack_ffffffffffffd820);
  if (in_RCX != (vec *)0x0) {
    KModel::operator=(in_stack_ffffffffffffc4c0,
                      (KModel *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  }
  local_1168 = *(uint *)(in_RDI + 0x20);
  local_116c = *(uint *)(in_RDI + 0x24);
  local_1170 = *(int *)(in_RDI + 0x4a4);
  local_1178.__r = (rep)Bench::tic();
  local_a38 = local_10a8;
  local_a30 = local_1318;
  arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(local_1318,local_a38);
  arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
            (&in_stack_ffffffffffffc4c0->R,
             (Op<arma::Mat<double>,_arma::op_htrans> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  LinearAlgebra::solve
            ((mat *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             in_stack_ffffffffffffc4f0);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(local_1318);
  local_a48 = (Mat<double> *)(in_RDI + 0x4a0);
  local_a40 = &local_1428;
  arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_1428,local_a48);
  local_970 = local_13e0;
  local_978 = &local_1428;
  local_980 = &local_1228;
  arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>::
  Glue(local_13e0,local_978,local_980);
  arma::Mat<double>::
  Mat<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_times>
            (&in_stack_ffffffffffffc4c0->R,
             (Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>
              *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>::
  ~Glue(local_13e0);
  arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_1428);
  arma::Mat<double>::Mat
            (&in_stack_ffffffffffffc4c0->R,
             (Mat<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  LinearAlgebra::safe_chol_lower
            ((mat *)CONCAT17(in_stack_ffffffffffffc59f,
                             CONCAT16(in_stack_ffffffffffffc59e,in_stack_ffffffffffffc598)));
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  local_898 = local_17f8;
  local_8a0 = &local_14d8;
  local_8a8 = 0;
  arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(local_17f8,local_8a0);
  arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
            (&in_stack_ffffffffffffc4c0->R,
             (Op<arma::Mat<double>,_arma::op_htrans> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  local_8b0 = local_1998;
  local_8b8 = &local_1228;
  local_8c0 = 0;
  arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(local_1998,local_8b8);
  arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
            (&in_stack_ffffffffffffc4c0->R,
             (Op<arma::Mat<double>,_arma::op_htrans> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  LinearAlgebra::solve
            ((mat *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             in_stack_ffffffffffffc4f0);
  LinearAlgebra::solve
            ((mat *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             in_stack_ffffffffffffc4f0);
  local_940 = &local_1650;
  local_948 = &local_1228;
  local_950 = &local_1708;
  arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
            (&local_1650,local_948,local_950);
  arma::Mat<double>::Mat<arma::Mat<double>,arma::Mat<double>,arma::glue_times>
            (&in_stack_ffffffffffffc4c0->R,
             (Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(&local_1650);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(local_1998);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(local_17f8);
  local_8d0 = local_10a8;
  local_8c8 = &local_1ae8;
  local_8d8 = 0;
  arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_1ae8,local_8d0);
  arma::solve<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>>
            ((Base<double,_arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)
             in_stack_ffffffffffffc4c8,(Base<double,_arma::Mat<double>_> *)in_stack_ffffffffffffc4c0
            );
  local_880 = &local_1a88;
  local_888 = &local_1aa0;
  local_890 = 0;
  arma::
  Op<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>,_arma::op_htrans>
  ::Op(&local_1a88,local_888);
  arma::Mat<double>::
  Mat<arma::Glue<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_solve_gen_default>,arma::op_htrans>
            (&in_stack_ffffffffffffc4c0->R,
             (Op<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>,_arma::op_htrans>
              *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  arma::
  Op<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>,_arma::op_htrans>
  ::~Op(&local_1a88);
  arma::
  Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>
  ::~Glue(&local_1aa0);
  arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_1ae8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffc500,
             (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             (allocator<char> *)in_stack_ffffffffffffc4f0);
  local_1b20 = local_1178.__r;
  local_1af0.__r =
       (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,in_stack_ffffffffffffc588
                      );
  local_1178.__r = local_1af0.__r;
  std::__cxx11::string::~string(local_1b10);
  std::allocator<char>::~allocator(&local_1b11);
  local_848 = (Col<double> *)(in_RDI + 0x230);
  local_838 = &local_1d50;
  local_840 = &local_1a48;
  arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>::Glue
            (&local_1d50,local_840,local_848);
  local_7e0 = (Col<double> *)(in_RDI + 0x230);
  local_7d8 = &local_1dc8;
  local_7e8 = 0;
  arma::Op<arma::Col<double>,_arma::op_htrans>::Op(&local_1dc8,local_7e0);
  local_808 = &local_1d80;
  local_810 = &local_1dc8;
  local_818 = local_1638;
  arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>::
  Glue(&local_1d80,local_810,local_818);
  local_830 = (Col<double> *)(in_RDI + 0x230);
  local_820 = &local_1d68;
  local_828 = &local_1d80;
  arma::
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
  ::Glue(&local_1d68,local_828,local_830);
  local_870 = &local_1d50;
  local_878 = &local_1d68;
  local_868 = local_1d38;
  local_4c8 = local_878;
  local_4c0 = local_870;
  local_4b8 = local_1d38;
  arma::Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_>::Proxy
            ((Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_> *)
             in_stack_ffffffffffffc4c0,
             (Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  arma::
  Proxy<arma::Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>_>
  ::Proxy((Proxy<arma::Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>_>
           *)in_stack_ffffffffffffc4c0,
          (Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
           *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  local_458 = auStack_1c88;
  local_450 = auStack_1c88;
  local_468 = local_1d38;
  local_460 = local_1d38;
  local_480 = arma::eglue_minus::text();
  local_470 = 1;
  local_474 = 1;
  local_478 = 1;
  if (local_1d38[0] != 1) {
    arma::arma_incompat_size_string_abi_cxx11_
              ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),SUB84(in_stack_ffffffffffffc6a8,0),
               in_stack_ffffffffffffc6a4,in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698
              );
    arma::arma_stop_logic_error<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffc4f0);
    std::__cxx11::string::~string(local_4a0);
  }
  arma::Mat<double>::
  Mat<arma::Glue<arma::Mat<double>,arma::Col<double>,arma::glue_times>,arma::Glue<arma::Glue<arma::Op<arma::Col<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_times>,arma::Col<double>,arma::glue_times>,arma::eglue_minus>
            (&in_stack_ffffffffffffc4c0->R,
             (eGlue<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>,_arma::Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>,_arma::eglue_minus>
              *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  local_7d0 = local_1d38;
  arma::
  Proxy<arma::Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>_>
  ::~Proxy((Proxy<arma::Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>_>
            *)0x194c3e);
  arma::Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_>::~Proxy
            ((Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_> *)0x194c4b)
  ;
  arma::
  Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
  ::~Glue(&local_1d68);
  arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>::
  ~Glue(&local_1d80);
  arma::Op<arma::Col<double>,_arma::op_htrans>::~Op(&local_1dc8);
  arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>::~Glue(&local_1d50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffc500,
             (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             (allocator<char> *)in_stack_ffffffffffffc4f0);
  local_1e00 = local_1178.__r;
  local_1dd0.__r =
       (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,in_stack_ffffffffffffc588
                      );
  local_1178.__r = local_1dd0.__r;
  std::__cxx11::string::~string(local_1df0);
  std::allocator<char>::~allocator(&local_1df1);
  if ((*(byte *)(in_RDI + 0xaf0) & 1) == 0) {
    local_1e08 = *(double *)(in_RDI + 0xae8);
  }
  else {
    local_7b8 = local_1bd8;
    local_7bc = 0;
    local_7c0 = 0;
    arma::arma_check_bounds<char[37]>
              (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
               (char (*) [37])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
    pdVar8 = arma::access::rw<double>
                       ((double *)
                        (local_1bb8 + (ulong)(uint)(local_7bc + local_7c0 * local_1bd8[0]) * 8));
    local_1e08 = *pdVar8 / (double)(local_1168 - local_1170);
  }
  local_1e10 = log(local_1e08 * (double)(local_1168 - local_1170));
  local_a50 = &local_1e78;
  local_a5c = 0;
  local_a60 = 0;
  local_a64 = 0;
  local_a58 = local_10a8;
  arma::arma_check_bounds<char[46]>
            (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
             (char (*) [46])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  local_a6c = local_10a8[0].n_rows - local_a60;
  local_a70 = local_10a8[0].n_cols - local_a64;
  puVar9 = std::min<unsigned_int>(&local_a6c,&local_a70);
  local_a68 = *puVar9;
  local_598 = &local_1e78;
  local_5a4 = local_a60;
  local_5a8 = local_a64;
  local_1e78.row_offset = local_a60;
  local_1e78.col_offset = local_a64;
  local_5ac = local_a68;
  local_5a0 = local_10a8;
  local_1e78.m = local_10a8;
  local_1e78.n_rows = local_a68;
  local_1e78.n_elem = local_a68;
  arma::eOp<arma::diagview<double>,_arma::eop_log>::eOp
            ((eOp<arma::diagview<double>,_arma::eop_log> *)in_stack_ffffffffffffc4c0,
             (diagview<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  rVar11 = arma::sum<arma::eOp<arma::diagview<double>,arma::eop_log>>
                     ((eOp<arma::diagview<double>,_arma::eop_log> *)0x1953f2);
  local_a78 = &local_1ed8;
  local_a84 = 0;
  local_a88 = 0;
  local_a8c = 0;
  local_a80 = &local_14d8;
  arma::arma_check_bounds<char[46]>
            (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
             (char (*) [46])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  local_a94 = local_14d8.n_rows - local_a88;
  local_a98 = local_14d8.n_cols - local_a8c;
  puVar9 = std::min<unsigned_int>(&local_a94,&local_a98);
  local_a90 = *puVar9;
  local_578 = &local_1ed8;
  local_584 = local_a88;
  local_588 = local_a8c;
  local_1ed8.row_offset = local_a88;
  local_1ed8.col_offset = local_a8c;
  local_58c = local_a90;
  local_580 = &local_14d8;
  local_1ed8.m = &local_14d8;
  local_1ed8.n_rows = local_a90;
  local_1ed8.n_elem = local_a90;
  arma::eOp<arma::diagview<double>,_arma::eop_log>::eOp
            ((eOp<arma::diagview<double>,_arma::eop_log> *)in_stack_ffffffffffffc4c0,
             (diagview<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  rVar12 = arma::sum<arma::eOp<arma::diagview<double>,arma::eop_log>>
                     ((eOp<arma::diagview<double>,_arma::eop_log> *)0x195651);
  dVar14 = (double)(local_1168 - local_1170) * -0.5 * local_1e10;
  arma::eOp<arma::diagview<double>,_arma::eop_log>::~eOp(&local_1eb8);
  arma::diagview<double>::~diagview(&local_1ed8);
  arma::eOp<arma::diagview<double>,_arma::eop_log>::~eOp(&local_1e58);
  arma::diagview<double>::~diagview(&local_1e78);
  local_1e18 = (-rVar11 - rVar12) + dVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffc500,
             (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             (allocator<char> *)in_stack_ffffffffffffc4f0);
  local_1f10 = local_1178.__r;
  local_1ee0.__r =
       (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,in_stack_ffffffffffffc588
                      );
  local_1178.__r = local_1ee0.__r;
  std::__cxx11::string::~string(local_1f00);
  std::allocator<char>::~allocator(&local_1f01);
  local_1f18 = 0.2;
  dVar14 = pow((double)local_1168,1.0 / (double)local_116c);
  local_1f20 = (1.0 / dVar14) * (local_1f18 + (double)local_116c);
  local_760 = (Mat<double> *)(in_RDI + 0x20);
  local_758 = &local_2388;
  local_764 = 0;
  arma::Op<arma::Mat<double>,_arma::op_max>::Op(&local_2388,local_760,0,0);
  local_748 = (Mat<double> *)(in_RDI + 0x20);
  local_740 = &local_23c8;
  local_74c = 0;
  arma::Op<arma::Mat<double>,_arma::op_min>::Op(&local_23c8,local_748,0,0);
  local_778 = &local_2388;
  local_780 = &local_23c8;
  local_770 = &local_2348;
  local_438 = local_780;
  local_430 = local_778;
  local_428 = &local_2348;
  arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_max>_>::Proxy
            ((Proxy<arma::Op<arma::Mat<double>,_arma::op_max>_> *)in_stack_ffffffffffffc4c0,
             (Op<arma::Mat<double>,_arma::op_max> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_min>_>::Proxy
            ((Proxy<arma::Op<arma::Mat<double>,_arma::op_min>_> *)in_stack_ffffffffffffc4c0,
             (Op<arma::Mat<double>,_arma::op_min> *)
             CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
  local_3c8 = &local_2348.P2;
  local_3c0 = &local_2348.P2;
  local_3d8 = &local_2348;
  local_3d0 = &local_2348;
  local_3f0 = arma::eglue_minus::text();
  if ((local_2348.P1.Q.n_rows != local_2348.P2.Q.n_rows) ||
     (local_2348.P1.Q.n_cols != local_2348.P2.Q.n_cols)) {
    arma::arma_incompat_size_string_abi_cxx11_
              ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),SUB84(in_stack_ffffffffffffc6a8,0),
               in_stack_ffffffffffffc6a4,in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698
              );
    arma::arma_stop_logic_error<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffc4f0);
    std::__cxx11::string::~string(local_410);
  }
  local_788 = &local_21e8;
  local_790 = &local_2348;
  local_798 = 0;
  arma::
  Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
  ::Op(&local_21e8,local_790);
  local_7b0 = pow((double)local_1168,1.0 / (double)local_116c);
  local_7a0 = local_21a8;
  local_7a8 = &local_21e8;
  arma::
  eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>,_arma::eop_scalar_div_post>
  ::eOp((eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>,_arma::eop_scalar_div_post>
         *)in_stack_ffffffffffffc4d0,
        (Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
         *)in_stack_ffffffffffffc4c8,(elem_type)in_stack_ffffffffffffc4c0);
  arma::Col<double>::
  Col<arma::eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,arma::op_max>,arma::Op<arma::Mat<double>,arma::op_min>,arma::eglue_minus>,arma::op_htrans>,arma::eop_scalar_div_post>>
            (in_stack_ffffffffffffc4e8,
             (Base<double,_arma::eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>,_arma::eop_scalar_div_post>_>
              *)in_stack_ffffffffffffc4e0);
  arma::
  eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>,_arma::eop_scalar_div_post>
  ::~eOp((eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>,_arma::eop_scalar_div_post>
          *)0x195c45);
  arma::
  Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
  ::~Op(&local_21e8);
  local_738 = &local_2348;
  arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_min>_>::~Proxy
            ((Proxy<arma::Op<arma::Mat<double>,_arma::op_min>_> *)0x195c7e);
  arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_max>_>::~Proxy
            ((Proxy<arma::Op<arma::Mat<double>,_arma::op_max>_> *)0x195c8b);
  arma::Op<arma::Mat<double>,_arma::op_min>::~Op(&local_23c8);
  arma::Op<arma::Mat<double>,_arma::op_max>::~Op(&local_2388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffc500,
             (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
             (allocator<char> *)in_stack_ffffffffffffc4f0);
  local_2400 = local_1178.__r;
  local_23d0.__r =
       (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,in_stack_ffffffffffffc588
                      );
  local_1178.__r = local_23d0.__r;
  std::__cxx11::string::~string(local_23f0);
  std::allocator<char>::~allocator(&local_23f1);
  local_718 = &local_2428;
  local_720 = &local_1fd8;
  local_3b8 = in_RSI;
  local_3b0 = local_720;
  local_3a8 = &local_2428;
  arma::Proxy<arma::Col<double>_>::Proxy(&local_2428,local_720);
  arma::Proxy<arma::Col<double>_>::Proxy(&local_2418,(Col<double> *)local_3b8);
  uVar15 = ((local_2428.Q)->super_Mat<double>).n_rows;
  local_398 = &local_2428;
  uVar6 = arma::Proxy<arma::Col<double>_>::get_n_cols(&local_2428);
  local_3a0 = &local_2418;
  uVar1 = ((local_2418.Q)->super_Mat<double>).n_rows;
  uVar7 = arma::Proxy<arma::Col<double>_>::get_n_cols(&local_2418);
  local_360 = arma::eglue_div::text();
  local_354 = uVar7;
  local_350 = uVar1;
  local_34c = uVar6;
  local_348 = uVar15;
  if ((uVar15 != uVar1) || (uVar6 != uVar7)) {
    arma::arma_incompat_size_string_abi_cxx11_
              ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),SUB84(in_stack_ffffffffffffc6a8,0),
               in_stack_ffffffffffffc6a4,in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698
              );
    arma::arma_stop_logic_error<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffc4f0);
    std::__cxx11::string::~string(local_380);
  }
  rVar11 = arma::accu<arma::eGlue<arma::Col<double>,arma::Col<double>,arma::eglue_div>>
                     ((eGlue<arma::Col<double>,_arma::Col<double>,_arma::eglue_div> *)
                      in_stack_ffffffffffffc4c0);
  dVar14 = local_1f18;
  local_710 = &local_2428;
  dVar10 = -local_1f20;
  local_2408 = rVar11;
  dVar13 = log(rVar11);
  local_2430 = dVar10 * rVar11 + dVar14 * dVar13;
  if (in_RDX != (vec *)0x0) {
    if ((*(byte *)(in_RDI + 0xaf0) & 1) == 0) {
      arma::Col<double>::Col<arma::fill::fill_zeros>
                ((Col<double> *)in_stack_ffffffffffffc4e0,
                 (uword)((ulong)in_stack_ffffffffffffc4d8 >> 0x20),
                 (fill_class<arma::fill::fill_zeros> *)in_stack_ffffffffffffc4d0);
      arma::Col<double>::operator=
                ((Col<double> *)in_stack_ffffffffffffc4c0,
                 (Col<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
      arma::Col<double>::~Col((Col<double> *)0x198a68);
      local_3670 = 1e-06;
      for (local_3674 = 0; local_3674 < local_116c; local_3674 = local_3674 + 1) {
        arma::Col<double>::Col
                  ((Col<double> *)in_stack_ffffffffffffc4c8,(Col<double> *)in_stack_ffffffffffffc4c0
                  );
        local_668 = local_3728;
        local_66c = local_3674;
        dVar14 = local_3670;
        pdVar8 = arma::access::rw<double>((double *)(local_3708 + (ulong)local_3674 * 8));
        *pdVar8 = *pdVar8 + dVar14;
        dVar14 = _logMargPost(in_RSI,in_RDX,in_RCX,in_R8,in_stack_fffffffffffff4e0);
        in_stack_ffffffffffffc4c8 =
             (Mat<double> *)((dVar14 - (local_1e18 + local_2430)) / local_3670);
        local_67c = local_3674;
        pdVar8 = arma::access::rw<double>((in_RDX->super_Mat<double>).mem + local_3674);
        *pdVar8 = (double)in_stack_ffffffffffffc4c8;
        arma::Col<double>::~Col((Col<double> *)0x198bc8);
      }
    }
    else {
      local_2438.__r = (rep)Bench::tic();
      local_1178.__r = local_2438.__r;
      arma::Col<double>::Col<arma::fill::fill_none>
                ((Col<double> *)in_stack_ffffffffffffc4e0,
                 (uword)((ulong)in_stack_ffffffffffffc4d8 >> 0x20),
                 (fill_class<arma::fill::fill_none> *)in_stack_ffffffffffffc4d0);
      local_8e0 = &local_2788;
      local_8e8 = &local_1a48;
      local_8f0 = 0;
      arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_2788,local_8e8);
      local_860 = (Col<double> *)(in_RDI + 0x230);
      local_850 = &local_27a0;
      local_858 = local_1638;
      arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>::Glue
                (&local_27a0,local_858,local_860);
      local_6f8 = &local_2788;
      local_700 = &local_27a0;
      local_6f0 = local_2748;
      local_338 = local_700;
      local_330 = local_6f8;
      local_328 = local_2748;
      arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_>::Proxy
                ((Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)in_stack_ffffffffffffc4c0,
                 (Op<arma::Mat<double>,_arma::op_htrans> *)
                 CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
      arma::Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_>::Proxy
                ((Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_> *)
                 in_stack_ffffffffffffc4c0,
                 (Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *)
                 CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
      local_2d0 = local_2648;
      local_2c8 = local_2648;
      local_320 = local_2748;
      local_2c0 = local_2748;
      local_2e8 = arma::eglue_minus::text();
      local_2e0 = 1;
      if ((local_2678 != local_2648[0]) || (local_2668 != 1)) {
        arma::arma_incompat_size_string_abi_cxx11_
                  ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),
                   SUB84(in_stack_ffffffffffffc6a8,0),in_stack_ffffffffffffc6a4,
                   in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698);
        arma::arma_stop_logic_error<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffc4f0);
        std::__cxx11::string::~string(local_308);
      }
      arma::Mat<double>::
      Mat<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Glue<arma::Mat<double>,arma::Col<double>,arma::glue_times>,arma::eglue_minus>
                (in_stack_ffffffffffffc4c8,
                 (eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>,_arma::eglue_minus>
                  *)in_stack_ffffffffffffc4c0);
      local_6e8 = local_2748;
      arma::Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_>::~Proxy
                ((Proxy<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>_> *)
                 0x19640b);
      arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_>::~Proxy
                ((Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)0x196418);
      arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>::~Glue(&local_27a0);
      arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_2788);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffc500,
                 (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                 (allocator<char> *)in_stack_ffffffffffffc4f0);
      local_27a8.__r =
           (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,
                           in_stack_ffffffffffffc588);
      local_1178.__r = local_27a8.__r;
      std::__cxx11::string::~string(local_27c8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffd837);
      arma::Cube<double>::Cube<arma::fill::fill_zeros>
                (in_stack_ffffffffffffc4d0,(uword)((ulong)in_stack_ffffffffffffc4c8 >> 0x20),
                 (uword)in_stack_ffffffffffffc4c8,(uword)((ulong)in_stack_ffffffffffffc4c0 >> 0x20),
                 (fill_class<arma::fill::fill_zeros> *)
                 CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
      for (local_2a5c = 0; local_2a5c < local_1168; local_2a5c = local_2a5c + 1) {
        for (local_2a60 = 0; local_2a60 < local_2a5c; local_2a60 = local_2a60 + 1) {
          pdVar8 = arma::access::rw<double>
                             ((double *)
                              (local_1138 + (ulong)(local_2a5c + local_2a60 * local_1158) * 8));
          in_stack_ffffffffffffc6a8 = *pdVar8;
          local_990 = in_RDI + 0x340;
          local_994 = local_2a5c * local_1168 + local_2a60;
          local_988 = local_2c38;
          arma::arma_check_bounds<char[32]>
                    (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
                     (char (*) [32])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
          arma::subview_col<double>::subview_col
                    (in_stack_ffffffffffffc4e0,in_stack_ffffffffffffc4d8,
                     (uword)((ulong)in_stack_ffffffffffffc4d0 >> 0x20));
          arma::Col<double>::Col<arma::subview<double>>
                    (in_stack_ffffffffffffc4e8,
                     (Base<double,_arma::subview<double>_> *)in_stack_ffffffffffffc4e0);
          std::function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::
          operator()((function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>
                      *)in_stack_ffffffffffffc4d8,(Col<double> *)in_stack_ffffffffffffc4d0,
                     (Col<double> *)in_stack_ffffffffffffc4c8);
          local_9a0 = &local_2aa8;
          local_9b0 = local_2b58;
          local_9a8 = in_stack_ffffffffffffc6a8;
          arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::eOp
                    ((eOp<arma::Col<double>,_arma::eop_scalar_times> *)in_stack_ffffffffffffc4d0,
                     (Col<double> *)in_stack_ffffffffffffc4c8,(elem_type)in_stack_ffffffffffffc4c0);
          local_9e8 = &local_2c68;
          in_stack_ffffffffffffc698 = (Cube<double> *)&local_2a58;
          local_9f4 = local_2a5c;
          local_9f8 = local_2a60;
          uVar16 = (undefined3)in_stack_ffffffffffffc6a4;
          in_stack_ffffffffffffc6a4 = CONCAT13(1,uVar16);
          if (local_2a5c < local_2a58) {
            in_stack_ffffffffffffc6a4 = CONCAT13(local_2a54 <= local_2a60,uVar16);
          }
          local_9f0 = in_stack_ffffffffffffc698;
          arma::arma_check_bounds<char[36]>
                    (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
                     (char (*) [36])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
          local_550 = in_stack_ffffffffffffc698->n_slices;
          local_530 = &local_2c68;
          local_53c = local_9f4;
          local_540 = local_9f8;
          local_544 = 0;
          local_548 = 1;
          local_54c = 1;
          local_2c68.aux_row1 = local_9f4;
          local_2c68.aux_col1 = local_9f8;
          local_2c68.aux_slice1 = 0;
          local_2c68.n_rows = 1;
          local_2c68.n_cols = 1;
          local_2c68.n_elem_slice = 1;
          local_538 = in_stack_ffffffffffffc698;
          local_2c68.m = in_stack_ffffffffffffc698;
          local_2c68.n_slices = local_550;
          local_2c68.n_elem = local_550;
          arma::subview_cube<double>::operator=
                    ((subview_cube<double> *)in_stack_ffffffffffffc680,
                     (Base<double,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_> *)
                     in_stack_ffffffffffffc678);
          arma::subview_cube<double>::~subview_cube(&local_2c68);
          arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::~eOp(&local_2aa8);
          arma::Col<double>::~Col((Col<double> *)0x1968a2);
          arma::Col<double>::~Col((Col<double> *)0x1968af);
          arma::subview_col<double>::~subview_col((subview_col<double> *)0x1968bc);
          local_a00 = &local_2c98;
          in_stack_ffffffffffffc680 = (Cube<double> *)&local_2a58;
          local_a0c = local_2a5c;
          local_a10 = local_2a60;
          local_a08 = in_stack_ffffffffffffc680;
          arma::arma_check_bounds<char[36]>
                    (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
                     (char (*) [36])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
          local_528 = in_stack_ffffffffffffc680->n_slices;
          in_stack_ffffffffffffc678 = &local_2c98;
          local_514 = local_a0c;
          local_518 = local_a10;
          local_51c = 0;
          local_520 = 1;
          local_524 = 1;
          local_2c98.aux_row1 = local_a0c;
          local_2c98.aux_col1 = local_a10;
          local_2c98.aux_slice1 = 0;
          local_2c98.n_rows = 1;
          local_2c98.n_cols = 1;
          local_2c98.n_elem_slice = 1;
          local_a18 = &local_2cc8;
          local_a24 = local_2a60;
          local_a28 = local_2a5c;
          local_a20 = (Cube<double> *)&local_2a58;
          local_510 = in_stack_ffffffffffffc680;
          local_508 = in_stack_ffffffffffffc678;
          local_2c98.m = in_stack_ffffffffffffc680;
          local_2c98.n_slices = local_528;
          local_2c98.n_elem = local_528;
          arma::arma_check_bounds<char[36]>
                    (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
                     (char (*) [36])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
          local_4e0 = &local_2cc8;
          local_4ec = local_a24;
          local_4f0 = local_a28;
          local_4f4 = 0;
          local_4f8 = 1;
          local_4fc = 1;
          local_2cc8.aux_row1 = local_a24;
          local_2cc8.aux_col1 = local_a28;
          local_2cc8.aux_slice1 = 0;
          local_2cc8.n_rows = 1;
          local_2cc8.n_cols = 1;
          local_2cc8.n_elem_slice = 1;
          local_2cc8.n_slices = local_2a4c;
          local_4e8 = (Cube<double> *)&local_2a58;
          local_2cc8.m = (Cube<double> *)&local_2a58;
          arma::subview_cube<double>::operator=
                    ((subview_cube<double> *)in_stack_ffffffffffffc4c0,
                     (subview_cube<double> *)
                     CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
          arma::subview_cube<double>::~subview_cube(&local_2cc8);
          arma::subview_cube<double>::~subview_cube(&local_2c98);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffc500,
                 (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                 (allocator<char> *)in_stack_ffffffffffffc4f0);
      local_2d00 = local_1178.__r;
      local_2cd0.__r =
           (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,
                           in_stack_ffffffffffffc588);
      local_1178.__r = local_2cd0.__r;
      std::__cxx11::string::~string(local_2cf0);
      std::allocator<char>::~allocator(&local_2cf1);
      arma::Mat<double>::Mat(&local_2db8);
      for (local_2dbc = 0; local_2dbc < local_116c; local_2dbc = local_2dbc + 1) {
        local_2dc8.__r = (rep)Bench::tic();
        local_1178.__r = local_2dc8.__r;
        arma::Cube<double>::slice
                  ((Cube<double> *)in_stack_ffffffffffffc4c0,in_stack_ffffffffffffc4bc);
        arma::Mat<double>::Mat
                  (&in_stack_ffffffffffffc4c0->R,
                   (Mat<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffc500,
                   (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                   (allocator<char> *)in_stack_ffffffffffffc4f0);
        local_2eb0 = local_1178.__r;
        local_2e80.__r =
             (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,
                             in_stack_ffffffffffffc588);
        local_1178.__r = local_2e80.__r;
        std::__cxx11::string::~string(local_2ea0);
        std::allocator<char>::~allocator(&local_2ea1);
        local_900 = local_10a8;
        local_8f8 = local_3248;
        local_908 = 0;
        arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(local_3248,local_900);
        arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
                  (&in_stack_ffffffffffffc4c0->R,
                   (Op<arma::Mat<double>,_arma::op_htrans> *)
                   CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
        LinearAlgebra::solve
                  ((mat *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                   in_stack_ffffffffffffc4f0);
        LinearAlgebra::solve
                  ((mat *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                   in_stack_ffffffffffffc4f0);
        local_910 = &local_30a8;
        local_918 = &local_3158;
        local_920 = 0;
        arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_30a8,local_918);
        local_958 = local_3310;
        local_960 = &local_2e78;
        local_968 = local_1638;
        arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::Glue
                  (local_3310,local_960,local_968);
        local_6d0 = &local_30a8;
        local_6d8 = local_3310;
        local_6c8 = local_3068;
        local_2a8 = local_6d8;
        local_2a0 = local_6d0;
        local_298 = local_3068;
        arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_>::Proxy
                  ((Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)in_stack_ffffffffffffc4c0
                   ,(Op<arma::Mat<double>,_arma::op_htrans> *)
                    CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
        arma::Proxy<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>_>::Proxy
                  ((Proxy<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>_> *)
                   in_stack_ffffffffffffc4c0,
                   (Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)
                   CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
        iVar5 = local_2f64;
        iVar4 = local_2f68;
        iVar3 = local_2f88;
        iVar2 = local_2f98;
        local_238 = &local_2f68;
        local_230 = &local_2f68;
        local_290 = local_3068;
        local_240 = local_3068;
        local_258 = arma::eglue_minus::text();
        if ((iVar2 != iVar4) || (iVar3 != iVar5)) {
          arma::arma_incompat_size_string_abi_cxx11_
                    ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),
                     SUB84(in_stack_ffffffffffffc6a8,0),in_stack_ffffffffffffc6a4,
                     in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698);
          arma::arma_stop_logic_error<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffc4f0);
          std::__cxx11::string::~string(local_278);
        }
        arma::Mat<double>::operator=
                  ((Mat<double> *)
                   CONCAT17(in_stack_ffffffffffffc59f,
                            CONCAT16(in_stack_ffffffffffffc59e,in_stack_ffffffffffffc598)),
                   in_stack_ffffffffffffc590);
        local_6c0 = local_3068;
        arma::Proxy<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>_>::~Proxy
                  ((Proxy<arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>_> *)
                   0x19768c);
        arma::Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_>::~Proxy
                  ((Proxy<arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)0x197699);
        arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>::~Glue(local_3310);
        arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_30a8);
        arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
        arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
        arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
        arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(local_3248);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffc500,
                   (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                   (allocator<char> *)in_stack_ffffffffffffc4f0);
        local_3348 = local_1178.__r;
        local_3318.__r =
             (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,
                             in_stack_ffffffffffffc588);
        local_1178.__r = local_3318.__r;
        std::__cxx11::string::~string(local_3338);
        std::allocator<char>::~allocator(&local_3339);
        local_aa0 = &local_3368;
        local_aac = 0;
        local_ab0 = 0;
        local_ab4 = 0;
        in_stack_ffffffffffffc59f = 0;
        in_stack_ffffffffffffc59e = 0;
        local_aa8 = &local_2db8;
        arma::arma_check_bounds<char[46]>
                  (SUB81((ulong)in_stack_ffffffffffffc4c0 >> 0x38,0),
                   (char (*) [46])CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
        local_abc = local_2db8.n_rows - local_ab0;
        local_ac0 = local_2db8.n_cols - local_ab4;
        puVar9 = std::min<unsigned_int>(&local_abc,&local_ac0);
        local_ab8 = *puVar9;
        local_558 = &local_3368;
        local_564 = local_ab0;
        local_568 = local_ab4;
        local_3368.row_offset = local_ab0;
        local_3368.col_offset = local_ab4;
        local_56c = local_ab8;
        local_560 = &local_2db8;
        local_3368.m = &local_2db8;
        local_3368.n_rows = local_ab8;
        local_3368.n_elem = local_ab8;
        in_stack_ffffffffffffc590 =
             (eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::eglue_minus>
              *)arma::sum<arma::diagview<double>>((diagview<double> *)0x197995);
        in_stack_ffffffffffffc588.__d.__r = (duration)(-(double)in_stack_ffffffffffffc590 / 2.0);
        local_7f8 = (Col<double> *)(in_RDI + 0x230);
        local_7f0 = &local_33d8;
        local_800 = 0;
        arma::Op<arma::Col<double>,_arma::op_htrans>::Op(&local_33d8,local_7f8);
        local_928 = &local_3418;
        local_930 = &local_2db8;
        local_938 = 0;
        arma::Op<arma::Mat<double>,_arma::op_htrans>::Op(&local_3418,local_930);
        local_688 = &local_3398;
        local_690 = &local_33d8;
        local_698 = &local_3418;
        arma::
        Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>
        ::Glue(&local_3398,local_690,local_698);
        local_6a0 = &local_3380;
        local_6a8 = &local_3398;
        local_6b0 = &local_2598;
        arma::
        Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
        ::Glue(&local_3380,local_6a8,local_6b0);
        in_stack_ffffffffffffc580 =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)arma::
                as_scalar<arma::Glue<arma::Op<arma::Col<double>,arma::op_htrans>,arma::Op<arma::Mat<double>,arma::op_htrans>,arma::glue_times>,arma::Mat<double>>
                          ((Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                            *)in_stack_ffffffffffffc4c0,
                           (result *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
        dVar14 = (double)in_stack_ffffffffffffc588.__d.__r +
                 (double)in_stack_ffffffffffffc580 / (local_1e08 * 2.0);
        local_658 = &local_24e8;
        local_65c = local_2dbc;
        in_stack_ffffffffffffc578 =
             (string *)arma::access::rw<double>(local_24e8.super_Mat<double>.mem + local_2dbc);
        *(double *)in_stack_ffffffffffffc578 = dVar14;
        arma::
        Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
        ::~Glue(&local_3380);
        arma::
        Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>
        ::~Glue(&local_3398);
        arma::Op<arma::Mat<double>,_arma::op_htrans>::~Op(&local_3418);
        arma::Op<arma::Col<double>,_arma::op_htrans>::~Op(&local_33d8);
        arma::diagview<double>::~diagview(&local_3368);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffc500,
                   (char *)CONCAT44(in_stack_ffffffffffffc4fc,in_stack_ffffffffffffc4f8),
                   (allocator<char> *)in_stack_ffffffffffffc4f0);
        local_3450 = local_1178.__r;
        local_3420.__r =
             (rep)Bench::toc(in_stack_ffffffffffffc580,in_stack_ffffffffffffc578,
                             in_stack_ffffffffffffc588);
        local_1178.__r = local_3420.__r;
        std::__cxx11::string::~string(local_3440);
        std::allocator<char>::~allocator(&local_3441);
        arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
      }
      local_9b8 = &local_3538;
      local_9c0 = local_1f18;
      local_9c8 = &local_1fd8;
      arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::eOp
                ((eOp<arma::Col<double>,_arma::eop_scalar_times> *)in_stack_ffffffffffffc4d0,
                 (Col<double> *)in_stack_ffffffffffffc4c8,(elem_type)in_stack_ffffffffffffc4c0);
      local_5f8 = &local_34f8;
      local_600 = &local_3538;
      local_608 = local_2408;
      arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>::
      eOp((eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post> *)
          in_stack_ffffffffffffc4d0,
          (eOp<arma::Col<double>,_arma::eop_scalar_times> *)in_stack_ffffffffffffc4c8,
          (elem_type)in_stack_ffffffffffffc4c0);
      local_9d0 = &local_3578;
      local_9d8 = local_1f20;
      local_9e0 = &local_1fd8;
      arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::eOp
                ((eOp<arma::Col<double>,_arma::eop_scalar_times> *)in_stack_ffffffffffffc4d0,
                 (Col<double> *)in_stack_ffffffffffffc4c8,(elem_type)in_stack_ffffffffffffc4c0);
      local_610 = &local_34b8;
      local_618 = &local_34f8;
      local_620 = &local_3578;
      local_228 = local_620;
      local_220 = local_618;
      local_218 = &local_34b8;
      arma::
      Proxy<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>_>
      ::Proxy(&local_34b8.P1,local_618);
      arma::Proxy<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_>::Proxy
                (&local_34b8.P2,local_228);
      local_188 = ((local_34b8.P1.Q)->P).Q;
      uVar15 = (((local_188->P).Q)->super_Mat<double>).n_rows;
      local_1b8 = &local_34b8.P2;
      uVar1 = ((((local_34b8.P2.Q)->P).Q)->super_Mat<double>).n_rows;
      local_1a0 = &local_34b8.P2;
      local_1c8 = &local_34b8;
      local_1c0 = &local_34b8;
      local_180 = local_188;
      local_1e0 = arma::eglue_minus::text();
      local_1d0 = 1;
      local_1d8 = 1;
      local_1d4 = uVar1;
      local_1cc = uVar15;
      if (uVar15 != uVar1) {
        arma::arma_incompat_size_string_abi_cxx11_
                  ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),
                   SUB84(in_stack_ffffffffffffc6a8,0),in_stack_ffffffffffffc6a4,
                   in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698);
        arma::arma_stop_logic_error<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffc4f0);
        std::__cxx11::string::~string(local_200);
      }
      local_5e8 = &local_35b8;
      arma::eOp<arma::Col<double>,_arma::eop_square>::eOp
                ((eOp<arma::Col<double>,_arma::eop_square> *)in_stack_ffffffffffffc4c0,
                 (Col<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
      local_628 = &local_3498;
      local_630 = &local_34b8;
      local_638 = &local_35b8;
      local_178 = local_638;
      local_170 = local_630;
      local_168 = &local_3498;
      arma::
      Proxy<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>_>
      ::Proxy(&local_3498.P1,local_630);
      arma::Proxy<arma::eOp<arma::Col<double>,_arma::eop_square>_>::Proxy(&local_3498.P2,local_178);
      local_e8 = ((local_3498.P1.Q)->P1).Q;
      local_d8 = (local_e8->P).Q;
      uVar15 = (((local_d8->P).Q)->super_Mat<double>).n_rows;
      local_108 = &local_3498.P2;
      uVar1 = ((((local_3498.P2.Q)->P).Q)->super_Mat<double>).n_rows;
      local_100 = &local_3498.P2;
      local_118 = &local_3498;
      local_110 = &local_3498;
      local_e0 = local_e8;
      local_d0 = local_d8;
      local_130 = arma::eglue_div::text();
      local_120 = 1;
      local_128 = 1;
      local_124 = uVar1;
      local_11c = uVar15;
      if (uVar15 != uVar1) {
        arma::arma_incompat_size_string_abi_cxx11_
                  ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),
                   SUB84(in_stack_ffffffffffffc6a8,0),in_stack_ffffffffffffc6a4,
                   in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698);
        arma::arma_stop_logic_error<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffc4f0);
        std::__cxx11::string::~string(local_150);
      }
      local_640 = local_3478;
      local_648 = &local_24e8;
      local_650 = &local_3498;
      this_01 = local_3478;
      local_b8 = local_650;
      local_b0 = local_648;
      local_a8 = this_01;
      arma::Proxy<arma::Col<double>_>::Proxy(this_01,local_648);
      arma::
      Proxy<arma::eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>_>
      ::Proxy((Proxy<arma::eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>_>
               *)(this_01 + 1),local_b8);
      uVar15 = (this_01->Q->super_Mat<double>).n_rows;
      local_a0 = this_01;
      uVar6 = arma::Proxy<arma::Col<double>_>::get_n_cols(this_01);
      local_50 = this_01 + 1;
      local_40 = local_50->Q;
      local_30 = *(undefined8 **)&local_40->super_Mat<double>;
      local_20 = (undefined8 *)*local_30;
      local_10 = (undefined8 *)*local_20;
      uVar1 = *(uword *)*local_10;
      local_48 = this_01 + 1;
      local_38 = local_40;
      local_28 = local_30;
      local_18 = local_20;
      local_8 = local_10;
      local_68 = arma::eglue_minus::text();
      local_60 = 1;
      local_5c = uVar1;
      local_58 = uVar6;
      local_54 = uVar15;
      if ((uVar15 != uVar1) || (uVar6 != 1)) {
        arma::arma_incompat_size_string_abi_cxx11_
                  ((uword)((ulong)in_stack_ffffffffffffc6a8 >> 0x20),
                   SUB84(in_stack_ffffffffffffc6a8,0),in_stack_ffffffffffffc6a4,
                   in_stack_ffffffffffffc6a0,(char *)in_stack_ffffffffffffc698);
        arma::arma_stop_logic_error<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffc4f0);
        std::__cxx11::string::~string(local_88);
      }
      arma::Col<double>::operator=
                ((Col<double> *)in_stack_ffffffffffffc4c8,
                 (Base<double,_arma::eGlue<arma::Col<double>,_arma::eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>,_arma::eglue_minus>_>
                  *)in_stack_ffffffffffffc4c0);
      local_5e0 = local_3478;
      local_5d0 = &local_3498;
      arma::eOp<arma::Col<double>,_arma::eop_square>::~eOp(&local_35b8);
      local_5c0 = &local_34b8;
      arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::~eOp(&local_3578);
      arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>::
      ~eOp(&local_34f8);
      arma::eOp<arma::Col<double>,_arma::eop_scalar_times>::~eOp(&local_3538);
      arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
      arma::Cube<double>::~Cube
                ((Cube<double> *)CONCAT44(in_stack_ffffffffffffc4bc,in_stack_ffffffffffffc4b8));
      arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
      arma::Col<double>::~Col((Col<double> *)0x19889f);
    }
  }
  this_00 = (KModel *)(local_1e18 + local_2430);
  arma::Col<double>::~Col((Col<double> *)0x198c53);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  arma::Mat<double>::~Mat(in_stack_ffffffffffffc4c8);
  KModel::~KModel(this_00);
  return (double)this_00;
}

Assistant:

double Kriging::_logMargPost(const arma::vec& _theta,
                             arma::vec* grad_out,
                             Kriging::KModel* model,
                             std::map<std::string, double>* bench) const {
  // arma::cout << " theta: " << _theta << arma::endl;

  // In RobustGaSP:
  // neg_log_marginal_post_approx_ref <- function(param,nugget,
  // nugget.est,R0,X,zero_mean,output,CL,a,b,kernel_type,alpha) {
  //  lml=log_marginal_lik(param,nugget,nugget.est,R0,X,zero_mean,output,kernel_type,alpha);
  //  lp=log_approx_ref_prior(param,nugget,nugget.est,CL,a,b);
  //  -(lml+lp)
  //}
  // double log_marginal_lik(const Vec param,double nugget, const bool nugget_est, const List R0, const
  // Eigen::Map<Eigen::MatrixXd>  &X,const String zero_mean,const Eigen::Map<Eigen::MatrixXd>  &output, Eigen::VectorXi
  // kernel_type,const Eigen::VectorXd alpha ){
  //  double nu=nugget;
  //  int param_size=param.size();
  //  Eigen::VectorXd beta= param.array().exp().matrix();
  //  ...beta
  //  R=R+nu*MatrixXd::Identity(num_obs,num_obs);  //not sure
  //
  //  LLT<MatrixXd> lltOfR(R);             // compute the cholesky decomposition of R called lltofR
  //  MatrixXd L = lltOfR.matrixL();   //retrieve factor L  in the decomposition
  //
  //  if(zero_mean=="Yes"){...}else{
  //
  //  int q=X.cols();
  //
  //  MatrixXd Rinv_X=L.transpose().triangularView<Upper>().solve(L.triangularView<Lower>().solve(X)); //one forward
  //  and one backward to compute R.inv%*%X MatrixXd Xt_Rinv_X=X.transpose()*Rinv_X; //Xt%*%R.inv%*%X
  //
  //  LLT<MatrixXd> lltOfXRinvX(Xt_Rinv_X); // cholesky decomposition of Xt_Rinv_X called lltOfXRinvX
  //  MatrixXd LX = lltOfXRinvX.matrixL();  //  retrieve factor LX  in the decomposition
  //  MatrixXd Rinv_X_Xt_Rinv_X_inv_Xt_Rinv=
  //  Rinv_X*(LX.transpose().triangularView<Upper>().solve(LX.triangularView<Lower>().solve(Rinv_X.transpose())));
  //  //compute  Rinv_X_Xt_Rinv_X_inv_Xt_Rinv through one forward and one backward solve MatrixXd yt_Rinv=
  //  (L.transpose().triangularView<Upper>().solve(L.triangularView<Lower>().solve(output))).transpose(); MatrixXd S_2=
  //  (yt_Rinv*output-output.transpose()*Rinv_X_Xt_Rinv_X_inv_Xt_Rinv*output); double log_S_2=log(S_2(0,0)); return
  //  (-(L.diagonal().array().log().matrix().sum())-(LX.diagonal().array().log().matrix().sum())-(num_obs-q)/2.0*log_S_2);
  //  }
  //}
  // double log_approx_ref_prior(const Vec param,double nugget, bool nugget_est, const Eigen::VectorXd CL,const double
  // a,const double b ){
  //  double nu=nugget;
  //  int param_size=param.size();beta
  //  Eigen::VectorX beta= param.array().exp().matrix();
  //  ...
  //  double t=CL.cwiseProduct(beta).sum()+nu;
  //  return -b*t + a*log(t);
  //}

  Kriging::KModel m = make_Model(_theta, bench);
  if (model != nullptr)
    *model = m;

  arma::uword n = m_X.n_rows;
  arma::uword d = m_X.n_cols;
  arma::uword p = m_F.n_cols;

  // RobustGaSP naming...
  // arma::mat X = m_F;
  // arma::mat L = fd->T;

  auto t0 = Bench::tic();
  // m.Fstar : fd->M = solve(L, X, LinearAlgebra::default_solve_opts);

  // arma::mat Rinv_X = solve(trans(L), fd->M, LinearAlgebra::default_solve_opts);
  arma::mat Rinv_X = LinearAlgebra::solve(m.L.t(), m.Fstar);

  // arma::mat Xt_Rinv_X = trans(X) * Rinv_X;  // Xt%*%R.inv%*%X
  arma::mat Xt_Rinv_X = m_F.t() * Rinv_X;

  // arma::mat LX = chol(Xt_Rinv_X, "lower");  //  retrieve factor LX  in the decomposition
  arma::mat LX = LinearAlgebra::safe_chol_lower(Xt_Rinv_X);

  // arma::mat Rinv_X_Xt_Rinv_X_inv_Xt_Rinv
  //     = Rinv_X
  //       * (solve(trans(LX),
  //                solve(LX, trans(Rinv_X), LinearAlgebra::default_solve_opts),
  //                LinearAlgebra::default_solve_opts));  // compute  Rinv_X_Xt_Rinv_X_inv_Xt_Rinv through one forward
  arma::mat Rinv_X_Xt_Rinv_X_inv_Xt_Rinv
      = Rinv_X
        * (LinearAlgebra::solve(
            trans(LX),
            LinearAlgebra::solve(LX, trans(Rinv_X))));  // compute  Rinv_X_Xt_Rinv_X_inv_Xt_Rinv through one forward

  arma::mat yt_Rinv = trans(solve(trans(m.L), m.ystar));
  t0 = Bench::toc(bench, "YtRi = Yt \\ Tt", t0);

  arma::mat S_2 = (yt_Rinv * m_y - trans(m_y) * Rinv_X_Xt_Rinv_X_inv_Xt_Rinv * m_y);
  t0 = Bench::toc(bench, "S2 = YtRi * y - yt * RiFFtRiFiFtRi * y", t0);

  double sigma2;
  if (m_est_sigma2) {
    sigma2 = S_2(0, 0) / (n - p);
  } else {
    sigma2 = m_sigma2;
  }
  double log_S_2 = log(sigma2 * (n - p));

  double log_marginal_lik = -sum(log(m.L.diag())) - sum(log(LX.diag())) - (n - p) / 2.0 * log_S_2;
  t0 = Bench::toc(bench, "lml = -Sum(log(diag(T))) - Sum(log(diag(TF)))...", t0);
  // arma::cout << " log_marginal_lik:" << log_marginal_lik << arma::endl;

  // Default prior params
  double a = 0.2;
  double b = 1.0 / pow(n, 1.0 / d) * (a + d);
  // t0 = Bench::toc(bench,"b             ", t0);

  arma::vec CL = trans(max(m_X, 0) - min(m_X, 0)) / pow(n, 1.0 / d);
  t0 = Bench::toc(bench, "CL = (max(X) - min(X)) / n^1/d", t0);

  double t = arma::accu(CL / _theta);
  // arma::cout << " a:" << a << arma::endl;
  // arma::cout << " b:" << b << arma::endl;
  // arma::cout << " t:" << t << arma::endl;

  double log_approx_ref_prior = -b * t + a * log(t);
  // arma::cout << " log_approx_ref_prior:" << log_approx_ref_prior << arma::endl;

  if (grad_out != nullptr) {
    // Eigen::VectorXd log_marginal_lik_deriv(const Eigen::VectorXd param,double nugget,  bool nugget_est, const List
    // R0, const Eigen::Map<Eigen::MatrixXd>  &X,const String zero_mean,const Eigen::Map<Eigen::MatrixXd>  &output,
    // Eigen::VectorXi kernel_type,const Eigen::VectorXd alpha){
    // ...
    // VectorXd ans=VectorXd::Ones(param_size);
    // ...
    // MatrixXd Q_output= yt_Rinv.transpose()-Rinv_X_Xt_Rinv_X_inv_Xt_Rinv*output;
    // MatrixXd dev_R_i;
    // MatrixXd Wb_ti;
    // //allow different choices of kernels
    //
    // for(int ti=0;ti<p;ti++){
    //   //kernel_type_ti=kernel_type[ti];
    //   if(kernel_type[ti]==3){
    //     dev_R_i=matern_5_2_deriv( R0[ti],R_ori,beta[ti]);  //now here I have R_ori instead of R
    //   }else {...}
    //   Wb_ti=(L.transpose().triangularView<Upper>().solve(L.triangularView<Lower>().solve(dev_R_i))).transpose()-dev_R_i*Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
    //   ans[ti]=-0.5*Wb_ti.diagonal().sum()+(num_obs-q)/2.0*(output.transpose()*Wb_ti.transpose()*Q_output/S_2(0,0))(0,0);
    // }

    if (m_est_sigma2) {
      t0 = Bench::tic();
      arma::vec ans = arma::vec(d, arma::fill::none);
      arma::mat Q_output = trans(yt_Rinv) - Rinv_X_Xt_Rinv_X_inv_Xt_Rinv * m_y;
      t0 = Bench::toc(bench, "Qo = YtRi - RiFFtRiFiFtRi * y", t0);

      arma::cube gradR = arma::cube(n, n, d, arma::fill::zeros);
      // const arma::vec zeros = arma::vec(d,arma::fill::zeros);
      for (arma::uword i = 0; i < n; i++) {
        // gradR.tube(i, i) = zeros;
        for (arma::uword j = 0; j < i; j++) {
          gradR.tube(i, j) = m.R.at(i, j) * _DlnCovDtheta(m_dX.col(i * n + j), _theta);
          gradR.tube(j, i) = gradR.tube(i, j);
        }
      }
      t0 = Bench::toc(bench, "gradR = R * dlnCov(dX)", t0);

      arma::mat Wb_k;
      for (arma::uword k = 0; k < d; k++) {
        t0 = Bench::tic();
        arma::mat gradR_k = gradR.slice(k);
        t0 = Bench::toc(bench, "gradR_k = gradR[k]", t0);

        Wb_k = trans(LinearAlgebra::solve(trans(m.L), LinearAlgebra::solve(m.L, gradR_k)))
               - gradR_k * Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
        t0 = Bench::toc(bench, "Wb_k = gradR_k \\ L \\ Tt - gradR_k * RiFFtRiFiFtRi", t0);

        ans[k] = -sum(Wb_k.diag()) / 2.0 + as_scalar(trans(m_y) * trans(Wb_k) * Q_output) / (2.0 * sigma2);
        t0 = Bench::toc(bench, "ans[k] = Sum(diag(Wb_k)) + yt * Wb_kt * Qo / S2...", t0);
      }
      // arma::cout << " log_marginal_lik_deriv:" << ans << arma::endl;
      // arma::cout << " log_approx_ref_prior_deriv:" <<  - (a * CL / t - b * CL) / pow(_theta, 2.0) << arma::endl;

      *grad_out = ans - (a * CL / t - b * CL) / square(_theta);
      // t0 = Bench::toc(bench," grad_out     ", t0);
    } else {  // TODO: we do not have (yet) formula when sigma2 is fixed... :(
      *grad_out = arma::vec(d, arma::fill::zeros);
      double _eps = 1e-6;
      for (arma::uword k = 0; k < d; k++) {
        arma::vec theta_eps = _theta;
        theta_eps[k] += _eps;
        (*grad_out)[k]
            = (_logMargPost(theta_eps, nullptr, nullptr, nullptr) - (log_marginal_lik + log_approx_ref_prior)) / _eps;
      }
    }
    // arma::cout << " grad_out:" << *grad_out << arma::endl;
  }

  // arma::cout << " lmp:" << (log_marginal_lik+log_approx_ref_prior) << arma::endl;
  return (log_marginal_lik + log_approx_ref_prior);
}